

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_writer_reader_phaser.c
# Opt level: O2

void hdr_phaser_flip_phase(hdr_writer_reader_phaser *p,int64_t sleep_time_ns)

{
  long lVar1;
  ulong uVar2;
  uint useconds;
  
  useconds = 1000000;
  if (sleep_time_ns < 1000000000) {
    useconds = (uint)(sleep_time_ns / 1000);
  }
  uVar2 = p->start_epoch;
  LOCK();
  (&p->even_end_epoch)[-1 < (long)uVar2] = ~uVar2 & 0x8000000000000000;
  UNLOCK();
  LOCK();
  lVar1 = p->start_epoch;
  p->start_epoch = ~uVar2 & 0x8000000000000000;
  UNLOCK();
  while (*(long *)((long)p + ((long)uVar2 >> 0x3f) * -8 + 8) != lVar1) {
    if (useconds == 0) {
      hdr_yield();
    }
    else {
      hdr_usleep(useconds);
    }
  }
  return;
}

Assistant:

void hdr_phaser_flip_phase(
    struct hdr_writer_reader_phaser* p, int64_t sleep_time_ns)
{
    bool caught_up;
    int64_t start_value_at_flip;
    /* TODO: is_held_by_current_thread */
    unsigned int sleep_time_us = sleep_time_ns < 1000000000 ? (unsigned int) (sleep_time_ns / 1000) : 1000000;

    int64_t start_epoch = _hdr_phaser_get_epoch(&p->start_epoch);

    bool next_phase_is_even = (start_epoch < 0);

    /* Clear currently used phase end epoch.*/
    int64_t initial_start_value;
    if (next_phase_is_even)
    {
        initial_start_value = 0;
        _hdr_phaser_set_epoch(&p->even_end_epoch, initial_start_value);
    }
    else
    {
        initial_start_value = INT64_MIN;
        _hdr_phaser_set_epoch(&p->odd_end_epoch, initial_start_value);
    }

    /* Reset start value, indicating new phase.*/
    start_value_at_flip = _hdr_phaser_reset_epoch(&p->start_epoch, initial_start_value);

    do
    {
        int64_t* end_epoch =
            next_phase_is_even ? &p->odd_end_epoch : &p->even_end_epoch;

        caught_up = _hdr_phaser_get_epoch(end_epoch) == start_value_at_flip;

        if (!caught_up)
        {
            if (sleep_time_us <= 0)
            {
                hdr_yield();
            }
            else
            {
                hdr_usleep(sleep_time_us);
            }
        }
    }
    while (!caught_up);
}